

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O3

bool __thiscall
duckdb::TrySimpleIntegerCast<short,true>(duckdb *this,char *buf,idx_t len,short *result,bool strict)

{
  char *pcVar1;
  duckdb dVar2;
  duckdb dVar3;
  byte bVar4;
  char *pcVar5;
  bool bVar6;
  char *pcVar7;
  long lVar8;
  IntegerCastData<short> *result_00;
  char *pcVar9;
  int iVar10;
  ulong uVar11;
  ushort uVar12;
  short sVar13;
  IntegerCastData<short> *pIVar14;
  IntegerCastData<short> *pIVar15;
  duckdb *pdVar16;
  uint uVar17;
  char *pcVar18;
  byte bVar19;
  uint uVar20;
  byte bVar21;
  IntegerCastData<short> *pIVar22;
  IntegerCastData<short> *pIVar23;
  IntegerCastData<short> *pIVar24;
  IntegerCastData<short> *pIVar25;
  IntegerCastData<short> *pIVar26;
  short local_5c;
  int16_t local_5a;
  IntegerDecimalCastData<short> local_58;
  IntegerCastData<short> *local_40;
  IntegerCastData<short> *local_38;
  
  if (buf == (char *)0x0) {
    return false;
  }
  pcVar7 = (char *)0x0;
  do {
    dVar2 = this[(long)pcVar7];
    result = (short *)CONCAT71((int7)((ulong)result >> 8),dVar2);
    if ((4 < (byte)dVar2 - 9) && (dVar2 != (duckdb)0x20)) {
      local_5c = 0;
      if (dVar2 == (duckdb)0x2d) {
        bVar6 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                          (this + (long)pcVar7,buf + -(long)pcVar7,(idx_t)&local_5c,
                           (IntegerCastData<short> *)result,strict);
      }
      else {
        if ((buf + -1 != pcVar7) && (dVar2 == (duckdb)0x30)) {
          dVar2 = (this + 1)[(long)pcVar7];
          result = (short *)(ulong)(byte)dVar2;
          if ((byte)dVar2 < 0x62) {
            if (dVar2 == (duckdb)0x42) {
LAB_017e20db:
              pcVar9 = buf + ~(ulong)pcVar7;
              if (&DAT_00000001 < pcVar9) {
                pcVar18 = &DAT_00000001;
                local_58.result._0_2_ = 0;
                goto LAB_017e20f5;
              }
              break;
            }
            if (dVar2 == (duckdb)0x58) {
LAB_017e1fb8:
              pcVar9 = buf + ~(ulong)pcVar7;
              if (&DAT_00000001 < pcVar9) {
                pcVar18 = &DAT_00000001;
                iVar10 = 0;
                goto LAB_017e1fdc;
              }
              break;
            }
          }
          else {
            if (dVar2 == (duckdb)0x62) goto LAB_017e20db;
            if (dVar2 == (duckdb)0x78) goto LAB_017e1fb8;
          }
        }
        bVar6 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                          (this + (long)pcVar7,buf + -(long)pcVar7,(idx_t)&local_5c,
                           (IntegerCastData<short> *)result,strict);
      }
      local_58.result._0_2_ = local_5c;
      if (bVar6 != false) goto LAB_017e278e;
      break;
    }
    pcVar7 = pcVar7 + 1;
  } while (buf != pcVar7);
LAB_017e2195:
  pcVar7 = (char *)0x0;
  while ((dVar2 = this[(long)pcVar7], (byte)dVar2 - 9 < 5 || (dVar2 == (duckdb)0x20))) {
    pcVar7 = pcVar7 + 1;
    if (buf == pcVar7) {
      return false;
    }
  }
  local_58.result = 0;
  local_58.decimal = 0;
  local_58._16_8_ = 0;
  result_00 = (IntegerCastData<short> *)(buf + -(long)pcVar7);
  if (dVar2 == (duckdb)0x2d) {
    if (buf + -1 == pcVar7) {
      IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,true>(&local_58);
      return false;
    }
    pIVar15 = (IntegerCastData<short> *)&DAT_00000001;
    local_58.result = 0;
    do {
      bVar4 = pcVar7[(long)(this + (long)&pIVar15->result)];
      bVar21 = bVar4 - 0x30;
      if (9 < bVar21) {
        pIVar14 = pIVar15;
        if (bVar4 != 0x2e) goto LAB_017e27bc;
        pIVar25 = (IntegerCastData<short> *)((long)&pIVar15->result + 1);
        pIVar24 = pIVar25;
        if (result_00 <= pIVar25) goto LAB_017e287b;
        local_58.decimal = 0;
        local_58.decimal_digits = 0;
        uVar12 = 0;
        pIVar14 = pIVar25;
        goto LAB_017e25b2;
      }
      uVar11 = (0x8000000000000000 - (ulong)bVar21) / 10;
      if (SBORROW8(local_58.result,-uVar11) != (long)(local_58.result + uVar11) < 0) {
        return false;
      }
      local_58.result = local_58.result * 10 - (ulong)bVar21;
      pIVar24 = result_00;
      if (buf + ~(ulong)pIVar15 == pcVar7) break;
      if ((pcVar7 + 1)[(long)(this + (long)&pIVar15->result)] == '_') {
        if (buf + (-2 - (long)pIVar15) == pcVar7) {
          return false;
        }
        pIVar15 = pIVar15 + 1;
        if (9 < (byte)(pcVar7[(long)(this + (long)pIVar15)] - 0x30U)) {
          return false;
        }
      }
      else {
        pIVar15 = (IntegerCastData<short> *)((long)&pIVar15->result + 1);
      }
      pIVar24 = pIVar15;
    } while (pIVar15 < result_00);
    goto LAB_017e2652;
  }
  if (dVar2 != (duckdb)0x30 || buf + -1 == pcVar7) {
LAB_017e2221:
    pIVar15 = (IntegerCastData<short> *)(ulong)(dVar2 == (duckdb)0x2b);
    if (result_00 <= pIVar15) {
LAB_017e2567:
      IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>(&local_58);
      return false;
    }
    uVar20 = 0xfffffffe;
    local_58.result = 0;
    pIVar14 = pIVar15;
    do {
      bVar4 = pcVar7[(long)(this + (long)&pIVar14->result)];
      bVar21 = bVar4 - 0x30;
      if (9 < bVar21) {
        pIVar25 = pIVar14;
        if (bVar4 != 0x2e) goto LAB_017e28b6;
        pIVar24 = (IntegerCastData<short> *)((long)&pIVar14->result + 1);
        pIVar26 = pIVar24;
        if (result_00 <= pIVar24) goto LAB_017e296c;
        local_58.decimal = 0;
        uVar20 = 0;
        pIVar23 = (IntegerCastData<short> *)0x0;
        pIVar25 = pIVar24;
        goto LAB_017e26a7;
      }
      if ((long)(((ulong)bVar21 ^ 0x7ffffffffffffffe) / 10) < local_58.result) {
        return false;
      }
      local_58.result = local_58.result * 10 + (ulong)bVar21;
      pIVar26 = result_00;
      if (buf + ~(ulong)pIVar14 == pcVar7) break;
      if ((pcVar7 + 1)[(long)(this + (long)&pIVar14->result)] == '_') {
        if (buf + (-2 - (long)pIVar14) == pcVar7) {
          return false;
        }
        pIVar14 = pIVar14 + 1;
        if (9 < (byte)(pcVar7[(long)(this + (long)pIVar14)] - 0x30U)) {
          return false;
        }
      }
      else {
        pIVar14 = (IntegerCastData<short> *)((long)&pIVar14->result + 1);
      }
      pIVar26 = pIVar14;
    } while (pIVar14 < result_00);
    goto LAB_017e276a;
  }
  dVar3 = (this + 1)[(long)pcVar7];
  if (0x61 < (byte)dVar3) {
    if (dVar3 == (duckdb)0x62) goto LAB_017e24c0;
    if (dVar3 == (duckdb)0x78) goto LAB_017e239f;
    goto LAB_017e2221;
  }
  if (dVar3 == (duckdb)0x42) {
LAB_017e24c0:
    pcVar9 = buf + ~(ulong)pcVar7;
    if (pcVar9 <= &DAT_00000001) goto LAB_017e2567;
    pcVar18 = &DAT_00000001;
    local_58.result = 0;
    do {
      pcVar1 = pcVar18 + (long)this;
      lVar8 = 0;
      if ((pcVar7 + 1)[(long)pcVar1] != '0') {
        if ((pcVar7 + 1)[(long)pcVar1] != '1') {
          return false;
        }
        lVar8 = 1;
      }
      pcVar5 = pcVar9;
      if (buf + (-2 - (long)pcVar18) != pcVar7) {
        if ((pcVar7 + 2)[(long)pcVar1] == '_') {
          if (buf + (-3 - (long)pcVar18) == pcVar7) {
            return false;
          }
          if (((pcVar7 + 3)[(long)pcVar1] & 0xfeU) != 0x30) {
            return false;
          }
          pcVar5 = pcVar18 + 2;
        }
        else {
          pcVar5 = pcVar18 + 1;
        }
      }
      pcVar18 = pcVar5;
      if (0x3fffffffffffffff < local_58.result) {
        return false;
      }
      local_58.result = lVar8 + local_58.result * 2;
    } while (pcVar18 < pcVar9);
  }
  else {
    if (dVar3 != (duckdb)0x58) goto LAB_017e2221;
LAB_017e239f:
    pcVar9 = buf + ~(ulong)pcVar7;
    if (pcVar9 <= &DAT_00000001) goto LAB_017e2567;
    pcVar18 = &DAT_00000001;
    local_58.result = 0;
    do {
      pcVar1 = pcVar18 + (long)this;
      bVar4 = (pcVar7 + 1)[(long)pcVar1];
      bVar21 = bVar4 | 0x20;
      if (0x19 < (byte)(bVar4 + 0xbf)) {
        bVar21 = bVar4;
      }
      bVar4 = bVar21 - 0x30;
      if ((byte)(bVar21 + 0x9f) < 6 || bVar4 < 10) {
        bVar19 = bVar21 + 0xa9;
        if (bVar21 < 0x61) {
          bVar19 = bVar4;
        }
      }
      else {
        bVar19 = bVar4;
        if (5 < (byte)(bVar21 + 0xbf)) {
          return false;
        }
      }
      pcVar5 = pcVar9;
      if (buf + (-2 - (long)pcVar18) != pcVar7) {
        if ((pcVar7 + 2)[(long)pcVar1] == '_') {
          if (buf + (-3 - (long)pcVar18) == pcVar7) {
            return false;
          }
          pcVar5 = pcVar18 + 2;
          if (9 < (byte)((pcVar7 + 3)[(long)pcVar1] - 0x30U)) {
            uVar20 = (byte)(pcVar7 + 3)[(long)pcVar1] - 0x41;
            if (0x25 < uVar20) {
              return false;
            }
            if ((0x3f0000003fU >> ((ulong)uVar20 & 0x3f) & 1) == 0) {
              return false;
            }
          }
        }
        else {
          pcVar5 = pcVar18 + 1;
        }
      }
      pcVar18 = pcVar5;
      if ((long)((ulong)(bVar19 >> 4) ^ 0x7ffffffffffffff) < local_58.result) {
        return false;
      }
      local_58.result = local_58.result * 0x10 + (ulong)bVar19;
    } while (pcVar18 < pcVar9);
  }
  bVar6 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>
                    (&local_58);
LAB_017e255e:
  if (bVar6 == false) {
    return false;
  }
  goto LAB_017e2789;
  while( true ) {
    pcVar5 = pcVar9;
    if (buf + (-2 - (long)pcVar18) != pcVar7) {
      if ((pcVar7 + 2)[(long)pcVar1] == '_') {
        if ((buf + (-3 - (long)pcVar18) == pcVar7) || (((pcVar7 + 3)[(long)pcVar1] & 0xfeU) != 0x30)
           ) goto LAB_017e2195;
        pcVar5 = pcVar18 + 2;
      }
      else {
        pcVar5 = pcVar18 + 1;
      }
    }
    pcVar18 = pcVar5;
    if (0x3fff < (short)local_58.result) goto LAB_017e2195;
    local_58.result._0_2_ = sVar13 + (short)local_58.result * 2;
    if (pcVar9 <= pcVar18) break;
LAB_017e20f5:
    pcVar1 = pcVar18 + (long)this;
    local_5c = (short)local_58.result;
    if ((pcVar7 + 1)[(long)pcVar1] == '0') {
      sVar13 = 0;
    }
    else {
      if ((pcVar7 + 1)[(long)pcVar1] != '1') goto LAB_017e2195;
      sVar13 = 1;
    }
  }
  goto LAB_017e278e;
LAB_017e1fdc:
  do {
    pcVar1 = pcVar18 + (long)this;
    bVar4 = (pcVar7 + 1)[(long)pcVar1];
    bVar21 = bVar4 | 0x20;
    if (0x19 < (byte)(bVar4 + 0xbf)) {
      bVar21 = bVar4;
    }
    uVar20 = bVar21 - 0x30;
    local_5c = (short)iVar10;
    if ((byte)(bVar21 + 0x9f) < 6 || (byte)uVar20 < 10) {
      uVar17 = bVar21 - 0x57;
      if (bVar21 < 0x61) {
        uVar17 = uVar20;
      }
      uVar20 = uVar17 & 0xff;
    }
    else if (5 < (byte)(bVar21 + 0xbf)) goto LAB_017e2195;
    pcVar5 = pcVar9;
    if (buf + (-2 - (long)pcVar18) != pcVar7) {
      if ((pcVar7 + 2)[(long)pcVar1] == '_') {
        if (buf + (-3 - (long)pcVar18) == pcVar7) goto LAB_017e2195;
        pcVar5 = pcVar18 + 2;
        if ((9 < (byte)((pcVar7 + 3)[(long)pcVar1] - 0x30U)) &&
           ((uVar17 = (byte)(pcVar7 + 3)[(long)pcVar1] - 0x41, 0x25 < uVar17 ||
            ((0x3f0000003fU >> ((ulong)uVar17 & 0x3f) & 1) == 0)))) goto LAB_017e2195;
      }
      else {
        pcVar5 = pcVar18 + 1;
      }
    }
    pcVar18 = pcVar5;
    if ((int)(uVar20 >> 4 & 0xf ^ 0x7ff) < (int)local_5c) goto LAB_017e2195;
    iVar10 = iVar10 * 0x10 + (uVar20 & 0xff);
  } while (pcVar18 < pcVar9);
  local_58.result._0_2_ = (short)iVar10;
  goto LAB_017e278e;
LAB_017e25b2:
  bVar4 = pcVar7[(long)(this + (long)&pIVar14->result)];
  bVar21 = bVar4 - 0x30;
  local_40 = pIVar25;
  if (9 < bVar21) {
    local_58._18_6_ = 0;
    if (pIVar14 <= pIVar25 && pIVar15 <= (IntegerCastData<short> *)&DAT_00000001) {
      return false;
    }
LAB_017e27bc:
    uVar20 = (uint)bVar4;
    if (bVar4 < 0x20) {
      if (4 < uVar20 - 9) {
        return false;
      }
LAB_017e27d2:
      pIVar15 = (IntegerCastData<short> *)((long)&pIVar14->result + 1);
      pIVar24 = pIVar15;
      if (pIVar15 < result_00) {
        do {
          if ((4 < (byte)pcVar7[(long)(this + (long)pIVar15)] - 9) &&
             (pcVar7[(long)(this + (long)pIVar15)] != 0x20)) {
            return false;
          }
          pIVar15 = (IntegerCastData<short> *)((long)&pIVar15->result + 1);
          pIVar24 = result_00;
        } while (result_00 != pIVar15);
      }
      goto LAB_017e2652;
    }
    if ((bVar4 != 0x65) && (uVar20 != 0x45)) {
      if (uVar20 != 0x20) {
        return false;
      }
      goto LAB_017e27d2;
    }
    if (pIVar14 == (IntegerCastData<short> *)&DAT_00000001) {
      return false;
    }
    if (result_00 <= (IntegerCastData<short> *)((long)&pIVar14->result + 1)) {
      return false;
    }
    local_5a = 0;
    pdVar16 = (duckdb *)(pcVar7 + (long)(this + (long)pIVar14) + 1);
    if (*pdVar16 == (duckdb)0x2d) {
      bVar6 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                        (pdVar16,buf + (~(ulong)pcVar7 - (long)pIVar14),(idx_t)&local_5a,result_00,
                         true);
    }
    else {
      bVar6 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                        (pdVar16,buf + (~(ulong)pcVar7 - (long)pIVar14),(idx_t)&local_5a,result_00,
                         true);
    }
    if (bVar6 == false) {
      return false;
    }
    bVar6 = IntegerDecimalCastOperation::HandleExponent<duckdb::IntegerDecimalCastData<short>,true>
                      (&local_58,local_5a);
    goto LAB_017e255e;
  }
  if (local_58.decimal <= (long)(((ulong)bVar21 ^ 0x7ffffffffffffffe) / 10)) {
    local_58.decimal_digits = uVar12 + 1;
    local_58.decimal = (ulong)bVar21 + local_58.decimal * 10;
    uVar12 = local_58.decimal_digits;
  }
  pIVar24 = result_00;
  if (buf + ~(ulong)pIVar14 != pcVar7) goto code_r0x017e2605;
  goto LAB_017e286b;
code_r0x017e2605:
  if ((pcVar7 + 1)[(long)(this + (long)&pIVar14->result)] == '_') {
    if (buf + (-2 - (long)pIVar14) == pcVar7) {
      return false;
    }
    pIVar14 = pIVar14 + 1;
    if (9 < (byte)(pcVar7[(long)(this + (long)pIVar14)] - 0x30U)) {
      return false;
    }
  }
  else {
    pIVar14 = (IntegerCastData<short> *)((long)&pIVar14->result + 1);
  }
  pIVar24 = pIVar14;
  if (result_00 <= pIVar14) goto LAB_017e286b;
  goto LAB_017e25b2;
LAB_017e286b:
  local_58._18_6_ = 0;
LAB_017e287b:
  if ((pIVar15 <= (IntegerCastData<short> *)&DAT_00000001) && (pIVar24 <= pIVar25)) {
    return false;
  }
LAB_017e2652:
  bVar6 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,true>
                    (&local_58);
  if (!bVar6) {
    return false;
  }
  if (pIVar24 < (IntegerCastData<short> *)0x2) {
    return false;
  }
  goto LAB_017e2789;
LAB_017e26a7:
  pIVar22 = pIVar23;
  bVar4 = pcVar7[(long)(this + (long)pIVar25)];
  bVar21 = bVar4 - 0x30;
  local_38 = pIVar24;
  if (9 < bVar21) {
    local_58._16_8_ = (ulong)pIVar22 & 0xffff;
    if (pIVar25 <= pIVar24 && pIVar14 <= pIVar15) {
      return false;
    }
LAB_017e28b6:
    uVar17 = (uint)bVar4;
    if (bVar4 < 0x20) {
      if (4 < uVar17 - 9) {
        return false;
      }
LAB_017e28cc:
      pIVar14 = (IntegerCastData<short> *)((long)&pIVar25->result + 1);
      pIVar26 = pIVar14;
      if (pIVar14 < result_00) {
        do {
          if ((4 < (byte)pcVar7[(long)(this + (long)pIVar14)] - 9) &&
             (pcVar7[(long)(this + (long)pIVar14)] != 0x20)) {
            return false;
          }
          pIVar14 = (IntegerCastData<short> *)((long)&pIVar14->result + 1);
          pIVar26 = result_00;
        } while (result_00 != pIVar14);
      }
      goto LAB_017e276a;
    }
    if ((bVar4 != 0x65) && (uVar17 != 0x45)) {
      if (uVar17 != 0x20) {
        return false;
      }
      goto LAB_017e28cc;
    }
    if (pIVar25 == pIVar15) {
      return false;
    }
    if (result_00 <= (IntegerCastData<short> *)((long)&pIVar25->result + 1U)) {
      return false;
    }
    local_5a = 0;
    pdVar16 = (duckdb *)(pcVar7 + (long)(this + (long)pIVar25) + 1);
    if (*pdVar16 == (duckdb)0x2d) {
      bVar6 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                        (pdVar16,buf + (~(ulong)pcVar7 - (long)pIVar25),(idx_t)&local_5a,result_00,
                         SUB41(uVar20,0));
    }
    else {
      bVar6 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                        (pdVar16,buf + (~(ulong)pcVar7 - (long)pIVar25),(idx_t)&local_5a,result_00,
                         SUB41(uVar20,0));
    }
    if (bVar6 == false) {
      return false;
    }
    bVar6 = IntegerDecimalCastOperation::HandleExponent<duckdb::IntegerDecimalCastData<short>,false>
                      (&local_58,local_5a);
    goto LAB_017e255e;
  }
  pIVar23 = pIVar22;
  if (local_58.decimal <= (long)(((ulong)bVar21 ^ 0x7ffffffffffffffe) / 10)) {
    uVar20 = uVar20 + 1;
    local_58.decimal = (ulong)bVar21 + local_58.decimal * 10;
    pIVar23 = (IntegerCastData<short> *)(ulong)uVar20;
  }
  pIVar26 = result_00;
  local_40 = pIVar22;
  if (buf + ~(ulong)pIVar25 != pcVar7) goto code_r0x017e270e;
  goto LAB_017e295c;
code_r0x017e270e:
  if ((pcVar7 + 1)[(long)(this + (long)pIVar25)] == '_') {
    if (buf + (-2 - (long)pIVar25) == pcVar7) {
      return false;
    }
    pIVar25 = pIVar25 + 1;
    if (9 < (byte)(pcVar7[(long)(this + (long)pIVar25)] - 0x30U)) {
      return false;
    }
  }
  else {
    pIVar25 = (IntegerCastData<short> *)((long)&pIVar25->result + 1);
  }
  pIVar26 = pIVar25;
  if (result_00 <= pIVar25) goto LAB_017e295c;
  goto LAB_017e26a7;
LAB_017e295c:
  local_58._16_8_ = (ulong)pIVar23 & 0xffff;
LAB_017e296c:
  if ((pIVar14 <= pIVar15) && (pIVar26 <= pIVar24)) {
    return false;
  }
LAB_017e276a:
  bVar6 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>
                    (&local_58);
  if (!bVar6) {
    return false;
  }
  if (pIVar26 <= pIVar15) {
    return false;
  }
LAB_017e2789:
LAB_017e278e:
  *(short *)len = (short)local_58.result;
  return true;
}

Assistant:

static bool TryIntegerCast(const char *buf, idx_t len, T &result, bool strict) {
	// skip any spaces at the start
	while (len > 0 && StringUtil::CharacterIsSpace(*buf)) {
		buf++;
		len--;
	}
	if (len == 0) {
		return false;
	}
	if (ZERO_INITIALIZE) {
		memset(&result, 0, sizeof(T));
	}
	// if the number is negative, we set the negative flag and skip the negative sign
	if (*buf == '-') {
		if (!IS_SIGNED) {
			// Need to check if its not -0
			idx_t pos = 1;
			while (pos < len) {
				if (buf[pos++] != '0') {
					return false;
				}
			}
		}
		return IntegerCastLoop<T, true, ALLOW_EXPONENT, OP, decimal_separator>(buf, len, result, strict);
	}
	if (len > 1 && *buf == '0') {
		if (buf[1] == 'x' || buf[1] == 'X') {
			// If it starts with 0x or 0X, we parse it as a hex value
			buf++;
			len--;
			return IntegerHexCastLoop<T, false, false, OP>(buf, len, result, strict);
		} else if (buf[1] == 'b' || buf[1] == 'B') {
			// If it starts with 0b or 0B, we parse it as a binary value
			buf++;
			len--;
			return IntegerBinaryCastLoop<T, false, false, OP>(buf, len, result, strict);
		} else if (strict && StringUtil::CharacterIsDigit(buf[1])) {
			// leading zeros are not allowed in strict mode
			return false;
		}
	}
	return IntegerCastLoop<T, false, ALLOW_EXPONENT, OP, decimal_separator>(buf, len, result, strict);
}